

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall llvm::ErrorList::join(ErrorList *this,Error *E1,Error *E2)

{
  bool bVar1;
  type pEVar2;
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  *pvVar3;
  ErrorList *this_00;
  Error local_a8;
  Error local_a0;
  unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_> local_98;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_90;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *local_88;
  Error local_80;
  __normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_*,_std::vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>_>
  local_78;
  const_iterator local_70;
  ErrorInfoBase *local_68;
  ErrorList *E2List_1;
  reference local_58;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
  *__range4;
  ErrorList *E2List;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> E2Payload;
  ErrorList *E1List;
  Error *E2_local;
  Error *E1_local;
  
  bVar1 = Error::operator_cast_to_bool(E1);
  if (bVar1) {
    bVar1 = Error::operator_cast_to_bool(E2);
    if (bVar1) {
      bVar1 = Error::isA<llvm::ErrorList>(E1);
      if (bVar1) {
        E2Payload._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )Error::getPtr(E1);
        bVar1 = Error::isA<llvm::ErrorList>(E2);
        if (bVar1) {
          Error::takePayload((Error *)&E2List);
          pEVar2 = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
                   operator*((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                              *)&E2List);
          __end4 = std::
                   vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                   ::begin((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                            *)(pEVar2 + 1));
          Payload = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                    std::
                    vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                    ::end((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                           *)(pEVar2 + 1));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_*,_std::vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>_>
                                        *)&Payload);
            if (!bVar1) break;
            local_58 = __gnu_cxx::
                       __normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_*,_std::vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>_>
                       ::operator*(&__end4);
            std::
            vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
            ::push_back((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                         *)((long)E2Payload._M_t.
                                  super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                                  .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl
                           + 8),local_58);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_*,_std::vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>_>
            ::operator++(&__end4);
          }
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &E2List);
        }
        else {
          pvVar3 = (vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                    *)((long)E2Payload._M_t.
                             super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8);
          Error::takePayload((Error *)&E2List_1);
          std::
          vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
          ::push_back(pvVar3,(value_type *)&E2List_1);
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &E2List_1);
        }
        Error::Error((Error *)this,E1);
      }
      else {
        bVar1 = Error::isA<llvm::ErrorList>(E2);
        if (bVar1) {
          local_68 = Error::getPtr(E2);
          pvVar3 = (vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                    *)(local_68 + 1);
          local_78._M_current =
               (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
               std::
               vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
               ::begin((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                        *)(local_68 + 1));
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>const*,std::vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>>
          ::
          __normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>*>
                    ((__normal_iterator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>const*,std::vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>>
                      *)&local_70,&local_78);
          Error::takePayload(&local_80);
          local_88 = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     std::
                     vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                     ::insert(pvVar3,local_70,(value_type *)&local_80);
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &local_80);
          Error::Error((Error *)this,E2);
        }
        else {
          this_00 = (ErrorList *)operator_new(0x20);
          Error::takePayload(&local_a0);
          Error::takePayload(&local_a8);
          ErrorList(this_00,(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                             *)&local_a0,
                    (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                    &local_a8);
          std::unique_ptr<llvm::ErrorList,std::default_delete<llvm::ErrorList>>::
          unique_ptr<std::default_delete<llvm::ErrorList>,void>
                    ((unique_ptr<llvm::ErrorList,std::default_delete<llvm::ErrorList>> *)&local_98,
                     this_00);
          std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>::
          unique_ptr<llvm::ErrorList,std::default_delete<llvm::ErrorList>,void>
                    ((unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>> *)
                     &local_90,&local_98);
          Error::Error((Error *)this,&local_90);
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr(&local_90);
          std::unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_>::~unique_ptr
                    (&local_98);
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &local_a8);
          std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::
          ~unique_ptr((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                      &local_a0);
        }
      }
    }
    else {
      Error::Error((Error *)this,E1);
    }
  }
  else {
    Error::Error((Error *)this,E2);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

static Error join(Error E1, Error E2) {
    if (!E1)
      return E2;
    if (!E2)
      return E1;
    if (E1.isA<ErrorList>()) {
      auto &E1List = static_cast<ErrorList &>(*E1.getPtr());
      if (E2.isA<ErrorList>()) {
        auto E2Payload = E2.takePayload();
        auto &E2List = static_cast<ErrorList &>(*E2Payload);
        for (auto &Payload : E2List.Payloads)
          E1List.Payloads.push_back(std::move(Payload));
      } else
        E1List.Payloads.push_back(E2.takePayload());

      return E1;
    }
    if (E2.isA<ErrorList>()) {
      auto &E2List = static_cast<ErrorList &>(*E2.getPtr());
      E2List.Payloads.insert(E2List.Payloads.begin(), E1.takePayload());
      return E2;
    }
    return Error(std::unique_ptr<ErrorList>(
        new ErrorList(E1.takePayload(), E2.takePayload())));
  }